

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>::
findUnionLeft(NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>
              *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  ulong uVar1;
  BranchNode<unsigned_long,_2U,_true> *self;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_> *pNVar2;
  
  uVar1 = (ulong)i;
  pNVar2 = this + uVar1 * 0x10 + 0x18;
  while( true ) {
    if (size <= uVar1) {
      return size;
    }
    if ((key->left <= *(ulong *)(pNVar2 + -8)) || (key->left <= *(long *)pNVar2 + 1U)) break;
    uVar1 = uVar1 + 1;
    pNVar2 = pNVar2 + 0x10;
  }
  return (uint32_t)uVar1;
}

Assistant:

uint32_t findUnionLeft(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        for (; i < size; i++) {
            // If we've found where we would insert this key as a new interval
            // based on its left value, stop and return that.
            auto curr = self.keyAt(i);
            if (curr.left >= key.left)
                return i;

            // Otherwise, if we've found an overlap, return it.
            if (curr.right + 1 >= key.left)
                return i;
        }

        return size;
    }